

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_create(REF_ADJ *ref_adj_ptr)

{
  REF_ADJ pRVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  int local_24;
  REF_INT i;
  REF_ADJ ref_adj;
  REF_ADJ *ref_adj_ptr_local;
  
  pRVar1 = (REF_ADJ)malloc(0x20);
  *ref_adj_ptr = pRVar1;
  if (*ref_adj_ptr == (REF_ADJ)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x1f,
           "ref_adj_create","malloc *ref_adj_ptr of REF_ADJ_STRUCT NULL");
    ref_adj_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_adj_ptr;
    pRVar1->nnode = 10;
    pRVar1->nitem = 0x14;
    if (pRVar1->nnode < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x25,
             "ref_adj_create","malloc ref_adj->first of REF_INT negative");
      ref_adj_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)pRVar1->nnode << 2);
      pRVar1->first = pRVar2;
      if (pRVar1->first == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x25,
               "ref_adj_create","malloc ref_adj->first of REF_INT NULL");
        ref_adj_ptr_local._4_4_ = 2;
      }
      else {
        for (local_24 = 0; local_24 < pRVar1->nnode; local_24 = local_24 + 1) {
          pRVar1->first[local_24] = -1;
        }
        if (pRVar1->nitem < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",
                 0x28,"ref_adj_create","malloc ref_adj->item of REF_ADJ_ITEM_STRUCT negative");
          ref_adj_ptr_local._4_4_ = 1;
        }
        else {
          pRVar3 = (REF_ADJ_ITEM)malloc((long)pRVar1->nitem << 3);
          pRVar1->item = pRVar3;
          if (pRVar1->item == (REF_ADJ_ITEM)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",
                   0x28,"ref_adj_create","malloc ref_adj->item of REF_ADJ_ITEM_STRUCT NULL");
            ref_adj_ptr_local._4_4_ = 2;
          }
          else {
            for (local_24 = 0; local_24 < pRVar1->nitem; local_24 = local_24 + 1) {
              pRVar1->item[local_24].ref = -1;
              pRVar1->item[local_24].next = local_24 + 1;
            }
            pRVar1->item[pRVar1->nitem + -1].next = -1;
            pRVar1->blank = 0;
            ref_adj_ptr_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return ref_adj_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_adj_create(REF_ADJ *ref_adj_ptr) {
  REF_ADJ ref_adj;
  REF_INT i;

  ref_malloc(*ref_adj_ptr, 1, REF_ADJ_STRUCT);
  ref_adj = (*ref_adj_ptr);

  ref_adj_nnode(ref_adj) = 10;
  ref_adj_nitem(ref_adj) = 20;

  ref_malloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
  for (i = 0; i < ref_adj_nnode(ref_adj); i++) ref_adj->first[i] = REF_EMPTY;

  ref_malloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
  for (i = 0; i < ref_adj_nitem(ref_adj); i++) {
    ref_adj->item[i].ref = REF_EMPTY;
    ref_adj->item[i].next = i + 1;
  }
  ref_adj->item[ref_adj_nitem(ref_adj) - 1].next = REF_EMPTY;
  ref_adj->blank = 0;

  return REF_SUCCESS;
}